

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassMessageEdition2024_Test::
~NameResolverTest_NestInFileClassMessageEdition2024_Test
          (NameResolverTest_NestInFileClassMessageEdition2024_Test *this)

{
  (this->super_NameResolverTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NameResolverTest_018d7a98;
  DescriptorPool::~DescriptorPool(&(this->super_NameResolverTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassMessageEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      message NestedInFileClassMessage {
        option features.(pb.java).nest_in_file_class = YES;
        int32 unused = 1;
      }
      message UnnestedMessage {
        int32 unused = 1;
        message NestedInUnnestedMessage {
          int32 unused = 1;
        }
      }
                )schema");

  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nested_in_file_message =
      file->FindMessageTypeByName("NestedInFileClassMessage");
  auto unnested_message = file->FindMessageTypeByName("UnnestedMessage");
  auto nested_in_unnested_message =
      unnested_message->FindNestedTypeByName("NestedInUnnestedMessage");

  EXPECT_EQ(resolver.GetClassName(unnested_message,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedMessage");
  EXPECT_EQ(resolver.GetClassName(nested_in_file_message,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassMessage");
  EXPECT_EQ(resolver.GetClassName(nested_in_unnested_message,
                                  /* immutable = */ true),
            PACKAGE_PREFIX
            "proto2_unittest.UnnestedMessage.NestedInUnnestedMessage");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_message),
            PACKAGE_PREFIX "proto2_unittest.UnnestedMessage");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_in_file_message),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassMessage");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_in_unnested_message),
            PACKAGE_PREFIX
            "proto2_unittest.UnnestedMessage$NestedInUnnestedMessage");
}